

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.h
# Opt level: O0

RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> * __thiscall
data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::set
          (RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this,int *key,
          WeightedGraphAdjSet<int,_int> *value)

{
  bool bVar1;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar2;
  TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_> local_c8;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *local_88;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *parent;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *node;
  TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_> local_68;
  WeightedGraphAdjSet<int,_int> *local_28;
  WeightedGraphAdjSet<int,_int> *value_local;
  int *key_local;
  RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this_local;
  
  local_28 = value;
  value_local = (WeightedGraphAdjSet<int,_int> *)key;
  key_local = (int *)this;
  bVar1 = isEmpty(this);
  if (bVar1) {
    pRVar2 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)operator_new(0x70);
    node._3_1_ = 1;
    TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::TreeElement
              (&local_68,(int *)value_local,local_28);
    RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
    ::RBTreeNode(pRVar2,&local_68);
    node._3_1_ = 0;
    this->_root = pRVar2;
    TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::~TreeElement(&local_68);
  }
  else {
    parent = this->_root;
    local_88 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
               ::parent(this->_root);
    while (parent != (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                      *)0x0) {
      if ((parent->element).key == *(int *)&value_local->_vptr_WeightedGraphAdjSet) {
        WeightedGraphAdjSet<int,_int>::operator=(&(parent->element).value,local_28);
        return this;
      }
      local_88 = parent;
      if (*(int *)&value_local->_vptr_WeightedGraphAdjSet < (parent->element).key) {
        parent = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                 ::left(parent);
      }
      else {
        parent = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                 ::right(parent);
      }
    }
    pRVar2 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)operator_new(0x70);
    TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::TreeElement
              (&local_c8,(int *)value_local,local_28);
    RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
    ::RBTreeNode(pRVar2,&local_c8);
    parent = pRVar2;
    TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::~TreeElement(&local_c8);
    if (*(int *)&value_local->_vptr_WeightedGraphAdjSet < (local_88->element).key) {
      RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
      ::insertLeft(local_88,parent,true);
    }
    else {
      RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
      ::insertRight(local_88,parent,true);
    }
    while (local_88 !=
           (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
            *)0x0) {
      local_88->node_count = local_88->node_count + 1;
      pRVar2 = _balance(this,local_88);
      local_88 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                 ::parent(pRVar2);
    }
    bVar1 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
            ::isRed(this->_root);
    if (bVar1) {
      RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
      ::flipColors(this->_root);
    }
  }
  return this;
}

Assistant:

inline
    RBTree<Key, Value>& RBTree<Key, Value>::set(const Key &key, const Value &value){
        if (isEmpty()) {
            _root = new RBTreeNode<TreeElement<Key, Value>>(TreeElement<Key, Value>(key, value));
            return *this;
        }
        auto node = _root;
        auto parent = _root->parent();
        while (node != nullptr) {
            if (node->element.key == key) {
                node->element.value = value;
                return *this;
            }
            parent = node;
            if (key < node->element.key) {
                node = node->left();
            } else {
                node = node->right();
            }
        }
        node = new RBTreeNode<TreeElement<Key, Value>>(TreeElement<Key, Value>(key, value));
        if (key < parent->element.key) {
            parent->insertLeft(node, true);
        } else {
            parent->insertRight(node, true);
        }
        while (parent != nullptr) {
            parent->node_count++;
            parent = _balance(parent)->parent();
        }
        // reset the root's color
        if (_root->isRed()) {
            _root->flipColors();
        }
        return *this;
    }